

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_chroma_vert_w16inp
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  short *psVar4;
  int iVar5;
  long lVar6;
  short *psVar7;
  short *psVar8;
  ulong uVar9;
  
  lVar2 = (long)src_strd;
  uVar1 = (ulong)(uint)(wd * 2);
  if (wd * 2 < 1) {
    uVar1 = 0;
  }
  if (ht < 1) {
    ht = 0;
  }
  psVar4 = pi2_src + -lVar2;
  for (iVar5 = 0; iVar5 != ht; iVar5 = iVar5 + 1) {
    psVar8 = psVar4;
    for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
      iVar3 = 0;
      psVar7 = psVar8;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        iVar3 = iVar3 + (int)*psVar7 * (int)pi1_coeff[lVar6];
        psVar7 = psVar7 + lVar2;
      }
      iVar3 = (iVar3 >> 6) + 0x20 >> 6;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      pu1_dst[uVar9] = (UWORD8)iVar3;
      psVar8 = psVar8 + 1;
    }
    pu1_dst = pu1_dst + dst_strd;
    psVar4 = psVar4 + lVar2;
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_vert_w16inp(WORD16 *pi2_src,
                                         UWORD8 *pu1_dst,
                                         WORD32 src_strd,
                                         WORD32 dst_strd,
                                         WORD8 *pi1_coeff,
                                         WORD32 ht,
                                         WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 1) * src_strd];
            }

            i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH;
            i4_tmp = CLIP_U8(i4_tmp);

            pu1_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pu1_dst += dst_strd;
    }

}